

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sandbox.cpp
# Opt level: O2

void __thiscall Sandbox::onPlot(Sandbox *this)

{
  Tracker *pTVar1;
  vec4 *pvVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  mapped_type pTVar8;
  double dVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  PlotType PVar13;
  void *pvVar14;
  Texture *pTVar15;
  mapped_type *ppTVar16;
  undefined8 extraout_RDX;
  ulong uVar17;
  int i;
  long lVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  vec<4,_float,_(glm::qualifier)0> vVar25;
  undefined8 uVar26;
  allocator local_79;
  string local_78;
  Tracker *local_58;
  Uniforms *local_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  undefined4 uStack_3c;
  
  if ((this->m_sceneRender).renderFbo.m_allocated != true) {
    return;
  }
  PVar13 = this->m_plot;
  if (PVar13 - PLOT_LUMA < 5) {
    bVar10 = haveChange(this);
    if (bVar10) {
      pTVar1 = &(this->uniforms).tracker;
      if ((this->uniforms).tracker.m_running == true) {
        std::__cxx11::string::string((string *)&local_78,"plot::histogram",&local_79);
        Tracker::begin(pTVar1,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
      }
      local_50 = &this->uniforms;
      local_58 = pTVar1;
      glBindFramebuffer(0x8d40,(this->m_sceneRender).renderFbo.m_fbo_id);
      iVar11 = vera::getWindowWidth();
      iVar12 = vera::getWindowHeight();
      uVar17 = (ulong)(iVar11 * iVar12 * 3);
      uVar26 = 0x1e2706;
      pvVar14 = operator_new__(uVar17);
      glReadPixels(0,0,iVar11,iVar12,0x1907,0x1401,pvVar14);
      glBindFramebuffer(0x8d40,0,extraout_RDX,uVar26);
      pvVar2 = this->m_plot_values;
      local_48 = 0.0;
      uStack_3c = 0;
      uVar23 = 0;
      uVar24 = 0;
      for (lVar18 = 0; lVar18 < (long)uVar17; lVar18 = lVar18 + 3) {
        bVar5 = *(byte *)((long)pvVar14 + lVar18);
        fVar19 = pvVar2[bVar5].field_0.x + 1.0;
        pvVar2[bVar5].field_0.x = fVar19;
        if (fVar19 <= local_48) {
          fVar19 = local_48;
        }
        bVar6 = *(byte *)((long)pvVar14 + lVar18 + 1);
        fVar22 = this->m_plot_values[bVar6].field_1.y + 1.0;
        this->m_plot_values[bVar6].field_1.y = fVar22;
        if (fVar22 <= fVar19) {
          fVar22 = fVar19;
        }
        bVar7 = *(byte *)((long)pvVar14 + lVar18 + 2);
        iVar11 = (int)((double)bVar7 * 0.114 + (double)bVar5 * 0.299 + (double)bVar6 * 0.587);
        auVar20._0_4_ = this->m_plot_values[bVar7].field_2.z + 1.0;
        auVar20._4_4_ = this->m_plot_values[iVar11].field_3.w + 1.0;
        auVar20._8_8_ = 0;
        this->m_plot_values[bVar7].field_2.z = auVar20._0_4_;
        this->m_plot_values[iVar11].field_3.w = auVar20._4_4_;
        auVar21._4_4_ = uStack_3c;
        auVar21._0_4_ = fVar22;
        auVar21._8_4_ = uVar23;
        auVar21._12_4_ = uVar24;
        auVar21 = maxps(auVar20,auVar21);
        local_48 = auVar21._0_4_;
        uStack_3c = auVar21._4_4_;
        uVar23 = auVar21._8_4_;
        uVar24 = auVar21._12_4_;
      }
      fStack_44 = local_48;
      fStack_40 = local_48;
      operator_delete__(pvVar14);
      for (lVar18 = 0; lVar18 != 0x1000; lVar18 = lVar18 + 0x10) {
        local_78._M_dataplus._M_p = (pointer)CONCAT44(fStack_44,local_48);
        local_78._M_string_length = CONCAT44(uStack_3c,fStack_40);
        vVar25 = glm::operator/((vec<4,_float,_(glm::qualifier)0> *)
                                ((long)&pvVar2->field_0 + lVar18),
                                (vec<4,_float,_(glm::qualifier)0> *)&local_78);
        *(vec<4,_float,_(glm::qualifier)0> *)((long)&pvVar2->field_0 + lVar18) = vVar25;
      }
      pTVar15 = this->m_plot_texture;
      if (pTVar15 == (Texture *)0x0) {
        pTVar15 = (Texture *)operator_new(0x48);
        vera::Texture::Texture(pTVar15);
        this->m_plot_texture = pTVar15;
      }
      (*pTVar15->_vptr_Texture[6])(pTVar15,0x100,1,4,0x20,pvVar2,1,1);
      pTVar8 = this->m_plot_texture;
      std::__cxx11::string::string((string *)&local_78,"u_histogram",&local_79);
      ppTVar16 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Texture_*>_>_>
                 ::operator[](&(this->uniforms).super_Scene.textures,&local_78);
      *ppTVar16 = pTVar8;
      std::__cxx11::string::~string((string *)&local_78);
      Uniforms::flagChange(local_50);
      if ((this->uniforms).tracker.m_running != true) {
        return;
      }
      std::__cxx11::string::string((string *)&local_78,"plot::histogram",&local_79);
      Tracker::end(local_58,&local_78);
      goto LAB_001e2b57;
    }
    PVar13 = this->m_plot;
  }
  if (PVar13 == PLOT_MS) {
    pTVar1 = &(this->uniforms).tracker;
    if ((this->uniforms).tracker.m_running == true) {
      std::__cxx11::string::string((string *)&local_78,"plot::ms",&local_79);
      Tracker::begin(pTVar1,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
    }
    for (lVar18 = 0; lVar18 != 0xff0; lVar18 = lVar18 + 0x10) {
      puVar3 = (undefined8 *)((long)&this->m_plot_values[1].field_0 + lVar18);
      uVar26 = puVar3[1];
      puVar4 = (undefined8 *)((long)&this->m_plot_values[0].field_0 + lVar18);
      *puVar4 = *puVar3;
      puVar4[1] = uVar26;
    }
    dVar9 = vera::getDelta();
    this->m_plot_values[0xff].field_0.x = (float)dVar9;
    this->m_plot_values[0xff].field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
    this->m_plot_values[0xff].field_2 =
         (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
    this->m_plot_values[0xff].field_3.w = 1.0;
    pTVar15 = this->m_plot_texture;
    if (pTVar15 == (Texture *)0x0) {
      pTVar15 = (Texture *)operator_new(0x48);
      vera::Texture::Texture(pTVar15);
      this->m_plot_texture = pTVar15;
    }
    (*pTVar15->_vptr_Texture[6])(pTVar15,0x100,1,4,0x20,this->m_plot_values,1,1);
    if ((this->uniforms).tracker.m_running != true) {
      return;
    }
    std::__cxx11::string::string((string *)&local_78,"plot::ms",&local_79);
    Tracker::end(pTVar1,&local_78);
  }
  else {
    if (PVar13 != PLOT_FPS) {
      return;
    }
    pTVar1 = &(this->uniforms).tracker;
    if ((this->uniforms).tracker.m_running == true) {
      std::__cxx11::string::string((string *)&local_78,"plot::fps",&local_79);
      Tracker::begin(pTVar1,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
    }
    for (lVar18 = 0; lVar18 != 0xff0; lVar18 = lVar18 + 0x10) {
      puVar3 = (undefined8 *)((long)&this->m_plot_values[1].field_0 + lVar18);
      uVar26 = puVar3[1];
      puVar4 = (undefined8 *)((long)&this->m_plot_values[0].field_0 + lVar18);
      *puVar4 = *puVar3;
      puVar4[1] = uVar26;
    }
    dVar9 = vera::getFps();
    this->m_plot_values[0xff].field_0.x = (float)(dVar9 / 60.0);
    this->m_plot_values[0xff].field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
    this->m_plot_values[0xff].field_2 =
         (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
    this->m_plot_values[0xff].field_3.w = 1.0;
    pTVar15 = this->m_plot_texture;
    if (pTVar15 == (Texture *)0x0) {
      pTVar15 = (Texture *)operator_new(0x48);
      vera::Texture::Texture(pTVar15);
      this->m_plot_texture = pTVar15;
    }
    (*pTVar15->_vptr_Texture[6])(pTVar15,0x100,1,4,0x20,this->m_plot_values,1,1);
    if ((this->uniforms).tracker.m_running != true) {
      return;
    }
    std::__cxx11::string::string((string *)&local_78,"plot::fps",&local_79);
    Tracker::end(pTVar1,&local_78);
  }
LAB_001e2b57:
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

void Sandbox::onPlot() {
    // if ( !vera::isGL() )
    //     return;
    if (!m_sceneRender.renderFbo.isAllocated())
        return;

    if ( (m_plot == PLOT_LUMA || m_plot == PLOT_RGB || m_plot == PLOT_RED || m_plot == PLOT_GREEN || m_plot == PLOT_BLUE ) && haveChange() ) {
        TRACK_BEGIN("plot::histogram")


        // Extract pixels
        glBindFramebuffer(GL_FRAMEBUFFER, m_sceneRender.renderFbo.getId());
        int w = vera::getWindowWidth();
        int h = vera::getWindowHeight();
        int c = 3;
        int total = w * h * c;
        unsigned char* pixels = new unsigned char[total];
        glReadPixels(0, 0, w, h, GL_RGB, GL_UNSIGNED_BYTE, pixels);
        glBindFramebuffer(GL_FRAMEBUFFER, 0);

        // Count frequencies of appearances 
        float max_rgb_freq = 0;
        float max_luma_freq = 0;
        glm::vec4 freqs[256];
        for (int i = 0; i < total; i += c) {
            m_plot_values[pixels[i]].r++;
            if (m_plot_values[pixels[i]].r > max_rgb_freq)
                max_rgb_freq = m_plot_values[pixels[i]].r;

            m_plot_values[pixels[i+1]].g++;
            if (m_plot_values[pixels[i+1]].g > max_rgb_freq)
                max_rgb_freq = m_plot_values[pixels[i+1]].g;

            m_plot_values[pixels[i+2]].b++;
            if (m_plot_values[pixels[i+2]].b > max_rgb_freq)
                max_rgb_freq = m_plot_values[pixels[i+2]].b;

            int luma = 0.299 * pixels[i] + 0.587 * pixels[i+1] + 0.114 * pixels[i+2];
            m_plot_values[luma].a++;
            if (m_plot_values[luma].a > max_luma_freq)
                max_luma_freq = m_plot_values[luma].a;
        }
        delete[] pixels;

        // Normalize frequencies
        for (int i = 0; i < 256; i ++)
            m_plot_values[i] = m_plot_values[i] / glm::vec4(max_rgb_freq, max_rgb_freq, max_rgb_freq, max_luma_freq);

        if (m_plot_texture == nullptr)
            m_plot_texture = new vera::Texture();
        m_plot_texture->load(256, 1, 4, 32, &m_plot_values[0], vera::NEAREST, vera::CLAMP);

        uniforms.textures["u_histogram"] = m_plot_texture;
        uniforms.flagChange();
        TRACK_END("plot::histogram")
    }

    else if (m_plot == PLOT_FPS ) {
        TRACK_BEGIN("plot::fps")

        // Push back values one position
        for (int i = 0; i < 255; i ++)
            m_plot_values[i] = m_plot_values[i+1];
        m_plot_values[255] = glm::vec4( vera::getFps()/60.0f, 0.0f, 0.0f, 1.0f);

        if (m_plot_texture == nullptr)
            m_plot_texture = new vera::Texture();

        m_plot_texture->load(256, 1, 4, 32, &m_plot_values[0], vera::NEAREST, vera::CLAMP);
        // uniforms.textures["u_sceneFps"] = m_plot_texture;

        TRACK_END("plot::fps")
    }

    else if (m_plot == PLOT_MS ) {
        TRACK_BEGIN("plot::ms")

        // Push back values one position
        for (int i = 0; i < 255; i ++)
            m_plot_values[i] = m_plot_values[i+1];
        m_plot_values[255] = glm::vec4( vera::getDelta(), 0.0f, 0.0f, 1.0f);

        if (m_plot_texture == nullptr)
            m_plot_texture = new vera::Texture();

        m_plot_texture->load(256, 1, 4, 32, &m_plot_values[0], vera::NEAREST, vera::CLAMP);

        // uniforms.textures["u_sceneMs"] = m_plot_texture;

        TRACK_END("plot::ms")
    }
}